

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O3

void __thiscall
QSharedDataPointer<QStyleSheetGeometryData>::detach_helper
          (QSharedDataPointer<QStyleSheetGeometryData> *this)

{
  QStyleSheetGeometryData *pQVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QStyleSheetGeometryData *pQVar5;
  
  pQVar5 = (QStyleSheetGeometryData *)operator_new(0x1c);
  pQVar1 = (this->d).ptr;
  (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> = (__atomic_base<int>)0x0;
  iVar2 = pQVar1->maxHeight;
  pQVar5->maxWidth = pQVar1->maxWidth;
  pQVar5->maxHeight = iVar2;
  iVar2 = pQVar1->minHeight;
  iVar3 = pQVar1->width;
  iVar4 = pQVar1->height;
  pQVar5->minWidth = pQVar1->minWidth;
  pQVar5->minHeight = iVar2;
  pQVar5->width = iVar3;
  pQVar5->height = iVar4;
  LOCK();
  (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar5->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + 1);
  UNLOCK();
  pQVar1 = (this->d).ptr;
  LOCK();
  (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int> =
       (__atomic_base<int>)
       ((__int_type)
        (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
        _q_value.super___atomic_base<int> + -1);
  UNLOCK();
  if ((__int_type)
      (pQVar1->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int> == 0) {
    operator_delete((this->d).ptr,0x1c);
  }
  (this->d).ptr = pQVar5;
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}